

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

short __thiscall
duckdb::Interpolator<false>::Interpolate<unsigned_long,short,duckdb::QuantileIndirect<short>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<short> *accessor)

{
  RESULT_TYPE_conflict RVar1;
  short sVar2;
  short sVar3;
  unsigned_long local_38;
  unsigned_long local_30;
  
  local_38 = hidx;
  local_30 = lidx;
  RVar1 = QuantileIndirect<short>::operator()(accessor,&local_30);
  sVar2 = Cast::Operation<short,short>(RVar1);
  if (lidx != hidx) {
    RVar1 = QuantileIndirect<short>::operator()(accessor,&local_38);
    sVar3 = Cast::Operation<short,short>(RVar1);
    sVar2 = (short)(int)((double)((int)sVar3 - (int)sVar2) *
                         (this->RN -
                         (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                          1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                        (double)(int)sVar2);
  }
  return sVar2;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}